

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_0::AsyncifyFlow::create(AsyncifyFlow *this)

{
  AsyncifyFlow *this_00;
  long in_RSI;
  
  this_00 = (AsyncifyFlow *)operator_new(0x98);
  AsyncifyFlow(this_00,*(ModuleAnalyzer **)(in_RSI + 0x58),(Type)*(uintptr_t *)(in_RSI + 0x60),
               (Name)((IString *)(in_RSI + 0x68))->str);
  (this->super_Pass)._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<AsyncifyFlow>(
      analyzer, pointerType, asyncifyMemory);
  }